

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_split_form_urlencoded(char *data,mg_header *form_fields,uint num_form_fields)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  
  uVar3 = 0xffffffff;
  if (data != (char *)0x0) {
    if (num_form_fields == 0 && form_fields == (mg_header *)0x0) {
      if (*data != '\0') {
        iVar2 = 1;
        do {
          if (*data == '&') {
            iVar2 = iVar2 + 1;
          }
          else if (*data == '\0') {
            return iVar2;
          }
          data = data + 1;
        } while( true );
      }
      uVar3 = 0;
    }
    else if (0 < (int)num_form_fields && form_fields != (mg_header *)0x0) {
      uVar7 = 0;
      pcVar4 = data;
      do {
        while( true ) {
          pcVar4 = pcVar4 + 1;
          cVar1 = *data;
          if ((cVar1 != '\t') && (cVar1 != ' ')) break;
          data = data + 1;
        }
        if (cVar1 == '\0') {
LAB_0011490f:
          num_form_fields = (uint)uVar7;
          break;
        }
        form_fields[uVar7].name = data;
        for (; (cVar1 = pcVar4[-1], cVar1 != '\0' && (cVar1 != '&')); pcVar4 = pcVar4 + 1) {
          if (cVar1 == '=') {
            pcVar4[-1] = '\0';
            data = pcVar4;
            goto LAB_001148e9;
          }
        }
        pcVar4 = (char *)0x0;
LAB_001148e9:
        form_fields[uVar7].value = pcVar4;
        uVar7 = uVar7 + 1;
        pcVar4 = strchr(data,0x26);
        if (pcVar4 == (char *)0x0) goto LAB_0011490f;
        *pcVar4 = '\0';
        data = pcVar4 + 1;
        pcVar4 = data;
      } while (uVar7 != num_form_fields);
      uVar3 = num_form_fields;
      if (0 < (int)num_form_fields) {
        lVar6 = 0;
        do {
          pcVar4 = *(char **)((long)&form_fields->name + lVar6);
          if (pcVar4 != (char *)0x0) {
            sVar5 = strlen(pcVar4);
            mg_url_decode(pcVar4,(int)sVar5,pcVar4,(int)sVar5 + 1,1);
          }
          pcVar4 = *(char **)((long)&form_fields->value + lVar6);
          if (pcVar4 != (char *)0x0) {
            sVar5 = strlen(pcVar4);
            mg_url_decode(pcVar4,(int)sVar5,pcVar4,(int)sVar5 + 1,1);
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)num_form_fields << 4 != lVar6);
      }
    }
  }
  return uVar3;
}

Assistant:

CIVETWEB_API int
mg_split_form_urlencoded(char *data,
                         struct mg_header *form_fields,
                         unsigned num_form_fields)
{
	char *b;
	int i;
	int num = 0;

	if (data == NULL) {
		/* parameter error */
		return -1;
	}

	if ((form_fields == NULL) && (num_form_fields == 0)) {
		/* determine the number of expected fields */
		if (data[0] == 0) {
			return 0;
		}
		/* count number of & to return the number of key-value-pairs */
		num = 1;
		while (*data) {
			if (*data == '&') {
				num++;
			}
			data++;
		}
		return num;
	}

	if ((form_fields == NULL) || ((int)num_form_fields <= 0)) {
		/* parameter error */
		return -1;
	}

	for (i = 0; i < (int)num_form_fields; i++) {
		/* extract key-value pairs from input data */
		while ((*data == ' ') || (*data == '\t')) {
			/* skip initial spaces */
			data++;
		}
		if (*data == 0) {
			/* end of string reached */
			break;
		}
		form_fields[num].name = data;

		/* find & or = */
		b = data;
		while ((*b != 0) && (*b != '&') && (*b != '=')) {
			b++;
		}

		if (*b == 0) {
			/* last key without value */
			form_fields[num].value = NULL;
		} else if (*b == '&') {
			/* mid key without value */
			form_fields[num].value = NULL;
		} else {
			/* terminate string */
			*b = 0;
			/* value starts after '=' */
			data = b + 1;
			form_fields[num].value = data;
		}

		/* new field is stored */
		num++;

		/* find a next key */
		b = strchr(data, '&');
		if (b == 0) {
			/* no more data */
			break;
		} else {
			/* terminate value of last field at '&' */
			*b = 0;
			/* next key-value-pairs starts after '&' */
			data = b + 1;
		}
	}

	/* Decode all values */
	for (i = 0; i < num; i++) {
		if (form_fields[i].name) {
			url_decode_in_place((char *)form_fields[i].name);
		}
		if (form_fields[i].value) {
			url_decode_in_place((char *)form_fields[i].value);
		}
	}

	/* return number of fields found */
	return num;
}